

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  uint32_t hash_00;
  Handle *pHVar1;
  Slice *in_RDI;
  _func_void_Slice_ptr_void_ptr *in_stack_00000018;
  uint32_t hash;
  
  hash_00 = HashSlice(in_RDI);
  Shard(hash_00);
  pHVar1 = LRUCache::Insert((LRUCache *)this,key,value._4_4_,(void *)charge,(size_t)deleter,
                            in_stack_00000018);
  return pHVar1;
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }